

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderDimmedBackgrounds(void)

{
  float fVar1;
  ImVec2 IVar2;
  float unaff_retaddr;
  ImDrawFlags unaff_retaddr_00;
  float in_stack_00000008;
  ImU32 in_stack_0000000c;
  ImVec2 *in_stack_00000010;
  undefined4 in_stack_00000018;
  ImU32 in_stack_0000001c;
  ImGuiWindow *in_stack_00000020;
  ImRect bb;
  float distance;
  ImGuiViewport *viewport;
  ImGuiWindow *window;
  ImGuiWindow *dim_behind_window;
  bool dim_bg_for_window_list;
  bool dim_bg_for_modal;
  ImGuiWindow *modal_window;
  ImGuiContext *g;
  ImDrawList *this;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 intersect_with_current_clip_rect;
  ImGuiWindow *in_stack_ffffffffffffffa0;
  ImGuiWindow *cr_max;
  ImVec2 *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  ImRect local_44;
  float local_34;
  ImGuiViewport *local_30;
  ImGuiWindow *local_28;
  ImGuiWindow *local_20;
  byte local_12;
  undefined1 local_11;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  
  intersect_with_current_clip_rect = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  local_8 = GImGui;
  local_10 = GetTopMostAndVisiblePopupModal();
  if ((0.0 < local_8->DimBgRatio) || (0.0 < local_8->NavWindowingHighlightAlpha)) {
    local_11 = local_10 != (ImGuiWindow *)0x0;
    uVar3 = in_stack_ffffffffffffffb0 & 0xffffff;
    if (local_8->NavWindowingTargetAnim != (ImGuiWindow *)0x0) {
      uVar3 = CONCAT13(local_8->NavWindowingTargetAnim->Active,(int3)in_stack_ffffffffffffffb0);
    }
    local_12 = (byte)(uVar3 >> 0x18) & 1;
    if (((bool)local_11) || ((uVar3 & 0x1000000) != 0)) {
      if ((bool)local_11) {
        local_20 = FindBottomMostVisibleWindowWithinBeginStack(in_stack_ffffffffffffffa0);
        GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                    (float)in_stack_ffffffffffffff90);
        RenderDimmedBackgroundBehindWindow(in_stack_00000020,in_stack_0000001c);
      }
      else if ((uVar3 & 0x1000000) != 0) {
        cr_max = local_8->NavWindowingTargetAnim;
        GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                    (float)in_stack_ffffffffffffff90);
        RenderDimmedBackgroundBehindWindow(in_stack_00000020,in_stack_0000001c);
        local_28 = local_8->NavWindowingTargetAnim;
        local_30 = GetMainViewport();
        local_34 = local_8->FontSize;
        local_44 = ImGuiWindow::Rect((ImGuiWindow *)0x4a3720);
        ImRect::Expand(&local_44,local_34);
        fVar1 = ImRect::GetWidth(&local_44);
        if (((local_30->Size).x <= fVar1) &&
           (fVar1 = ImRect::GetHeight(&local_44), (local_30->Size).y <= fVar1)) {
          ImRect::Expand(&local_44,-local_34 - 1.0);
        }
        if ((local_28->DrawList->CmdBuffer).Size == 0) {
          ImDrawList::AddDrawCmd((ImDrawList *)CONCAT44(in_stack_ffffffffffffffb4,uVar3));
        }
        this = (ImDrawList *)&local_30->Pos;
        IVar2 = ::operator+((ImVec2 *)local_28->DrawList,(ImVec2 *)0x4a37db);
        ImDrawList::PushClipRect
                  ((ImDrawList *)CONCAT44(IVar2.x,uVar3),in_stack_ffffffffffffffa8,(ImVec2 *)cr_max,
                   (bool)intersect_with_current_clip_rect);
        GetColorU32((ImGuiCol)((ulong)&local_44 >> 0x20),SUB84(&local_44,0));
        ImDrawList::AddRect((ImDrawList *)in_stack_00000020,
                            (ImVec2 *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                            in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                            unaff_retaddr);
        ImDrawList::PopClipRect(this);
      }
    }
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgrounds()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* modal_window = GetTopMostAndVisiblePopupModal();
    if (g.DimBgRatio <= 0.0f && g.NavWindowingHighlightAlpha <= 0.0f)
        return;
    const bool dim_bg_for_modal = (modal_window != NULL);
    const bool dim_bg_for_window_list = (g.NavWindowingTargetAnim != NULL && g.NavWindowingTargetAnim->Active);
    if (!dim_bg_for_modal && !dim_bg_for_window_list)
        return;

    if (dim_bg_for_modal)
    {
        // Draw dimming behind modal or a begin stack child, whichever comes first in draw order.
        ImGuiWindow* dim_behind_window = FindBottomMostVisibleWindowWithinBeginStack(modal_window);
        RenderDimmedBackgroundBehindWindow(dim_behind_window, GetColorU32(ImGuiCol_ModalWindowDimBg, g.DimBgRatio));
    }
    else if (dim_bg_for_window_list)
    {
        // Draw dimming behind CTRL+Tab target window
        RenderDimmedBackgroundBehindWindow(g.NavWindowingTargetAnim, GetColorU32(ImGuiCol_NavWindowingDimBg, g.DimBgRatio));

        // Draw border around CTRL+Tab target window
        ImGuiWindow* window = g.NavWindowingTargetAnim;
        ImGuiViewport* viewport = GetMainViewport();
        float distance = g.FontSize;
        ImRect bb = window->Rect();
        bb.Expand(distance);
        if (bb.GetWidth() >= viewport->Size.x && bb.GetHeight() >= viewport->Size.y)
            bb.Expand(-distance - 1.0f); // If a window fits the entire viewport, adjust its highlight inward
        if (window->DrawList->CmdBuffer.Size == 0)
            window->DrawList->AddDrawCmd();
        window->DrawList->PushClipRect(viewport->Pos, viewport->Pos + viewport->Size);
        window->DrawList->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_NavWindowingHighlight, g.NavWindowingHighlightAlpha), window->WindowRounding, 0, 3.0f);
        window->DrawList->PopClipRect();
    }
}